

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::TrackEvent::ParseFromArray(TrackEvent *this,void *raw,size_t size)

{
  pointer puVar1;
  pointer plVar2;
  pointer pdVar3;
  uint64_t uVar4;
  undefined1 uVar5;
  uint uVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  uint64_t *puVar9;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t *end;
  ulong uVar13;
  uint64_t preamble;
  uint32_t local_b0;
  ushort local_ac;
  uint8_t local_aa;
  uint64_t int_value;
  uint64_t payload_length;
  bitset<47UL> *local_98;
  string *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  vector<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  *local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  vector<long,_std::allocator<long>_> *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  uint64_t payload_length_1;
  
  puVar1 = (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish = puVar1;
  }
  local_40 = &this->categories_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_40);
  puVar1 = (this->extra_counter_track_uuids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->extra_counter_track_uuids_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->extra_counter_track_uuids_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  plVar2 = (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar2) {
    (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar2;
  }
  puVar1 = (this->extra_double_counter_track_uuids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->extra_double_counter_track_uuids_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->extra_double_counter_track_uuids_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pdVar3 = (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish != pdVar3) {
    (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl
    .super__Vector_impl_data._M_finish = pdVar3;
  }
  puVar1 = (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (this->terminating_flow_ids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->terminating_flow_ids_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  local_48 = &this->category_iids_;
  local_50 = &this->extra_counter_track_uuids_;
  local_58 = &this->extra_counter_values_;
  local_60 = &this->extra_double_counter_track_uuids_;
  local_68 = &this->extra_double_counter_values_;
  local_70 = &this->flow_ids_;
  local_78 = &this->terminating_flow_ids_;
  local_80 = &this->debug_annotations_;
  std::
  vector<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ::clear(local_80);
  local_88 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar12 = 0;
  do {
    if (end <= raw) goto switchD_002e6a75_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar9 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar9 != (uint64_t *)raw) goto LAB_002e6a3b;
LAB_002e7050:
      uVar12 = 0;
      uVar10 = 0;
      goto LAB_002e6b95;
    }
    puVar9 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002e6a3b:
    uVar4 = preamble;
    uVar13 = preamble >> 3;
    uVar6 = (uint)uVar13;
    if ((uVar6 == 0) || (end <= puVar9)) goto LAB_002e7050;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar7 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar9,(uint8_t *)end,&int_value);
      uVar11 = 0;
      uVar10 = 0;
      if (puVar7 == puVar9) goto LAB_002e6b95;
      break;
    case 1:
      puVar7 = puVar9 + 1;
      if (end < puVar7) goto switchD_002e6a75_caseD_3;
      int_value = *puVar9;
LAB_002e6ac6:
      uVar11 = 0;
      break;
    case 2:
      local_98 = (bitset<47UL> *)puVar9;
      puVar9 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar9,(uint8_t *)end,&payload_length)
      ;
      if (((bitset<47UL> *)puVar9 == local_98) ||
         ((ulong)((long)end - (long)puVar9) < payload_length)) goto switchD_002e6a75_caseD_3;
      puVar7 = (uint64_t *)((long)puVar9 + payload_length);
      uVar11 = payload_length;
      int_value = (uint64_t)puVar9;
      break;
    default:
      goto switchD_002e6a75_caseD_3;
    case 5:
      puVar7 = (uint64_t *)((long)puVar9 + 4);
      if (puVar7 <= end) {
        int_value = (uint64_t)(uint)*puVar9;
        goto LAB_002e6ac6;
      }
      goto switchD_002e6a75_caseD_3;
    }
    raw = puVar7;
  } while ((0xffff < uVar6) || (0xfffffff < uVar11));
  uVar12 = uVar11 | (uVar4 & 7) << 0x30 | uVar13 << 0x20;
  uVar10 = int_value;
LAB_002e6b95:
  local_98 = &this->_has_field_;
  local_90 = &this->name_;
LAB_002e6bb2:
  do {
    preamble = uVar10;
    local_b0 = (uint32_t)uVar12;
    local_aa = (uint8_t)(uVar12 >> 0x30);
    uVar6 = (uint)(uVar12 >> 0x20);
    local_ac = (ushort)(uVar12 >> 0x20);
    if (local_ac == 0) {
      return end == (uint64_t *)raw;
    }
    if (local_ac < 0x2f) {
      std::bitset<47UL>::set(local_98,(ulong)(uVar6 & 0x3f),true);
      uVar6 = (uint)local_ac;
    }
    uVar6 = (uVar6 & 0xffff) - 1;
    if (uVar6 < 0x2e) {
      uVar5 = (*(code *)(&DAT_0037af98 + *(int *)(&DAT_0037af98 + (ulong)uVar6 * 4)))();
      return (bool)uVar5;
    }
    protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
              ((Field *)&preamble,local_88);
    do {
      if (end <= raw) {
        uVar12 = 0;
        uVar10 = 0;
        goto LAB_002e6bb2;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar9 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar9 != (uint64_t *)raw) goto LAB_002e6ede;
LAB_002e7021:
        uVar12 = 0;
        uVar10 = 0;
        goto LAB_002e6bb2;
      }
      puVar9 = (uint64_t *)((long)raw + 1);
      int_value = (long)(char)*raw;
LAB_002e6ede:
      uVar4 = int_value;
      uVar13 = int_value >> 3;
      uVar6 = (uint)uVar13;
      if ((uVar6 == 0) || (end <= puVar9)) goto LAB_002e7021;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar7 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar9,(uint8_t *)end,&payload_length);
        uVar11 = 0;
        uVar12 = 0;
        uVar10 = 0;
        if (puVar7 == puVar9) goto LAB_002e6bb2;
        break;
      case 1:
        puVar7 = puVar9 + 1;
        if (end < puVar7) goto switchD_002e6f1d_caseD_3;
        payload_length = *puVar9;
LAB_002e6f74:
        uVar11 = 0;
        break;
      case 2:
        puVar8 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar9,(uint8_t *)end,&payload_length_1);
        if ((puVar8 == puVar9) || ((ulong)((long)end - (long)puVar8) < payload_length_1))
        goto switchD_002e6f1d_caseD_3;
        puVar7 = (uint64_t *)((long)puVar8 + payload_length_1);
        uVar11 = payload_length_1;
        payload_length = (uint64_t)puVar8;
        break;
      default:
        goto switchD_002e6f1d_caseD_3;
      case 5:
        puVar7 = (uint64_t *)((long)puVar9 + 4);
        if (puVar7 <= end) {
          payload_length = (uint64_t)(uint)*puVar9;
          goto LAB_002e6f74;
        }
        goto switchD_002e6f1d_caseD_3;
      }
      raw = puVar7;
    } while ((0xffff < uVar6) || (0xfffffff < uVar11));
    uVar12 = uVar11 | (uVar4 & 7) << 0x30 | uVar13 << 0x20;
    uVar10 = payload_length;
  } while( true );
switchD_002e6a75_caseD_3:
  uVar12 = 0;
  uVar10 = 0;
  goto LAB_002e6b95;
switchD_002e6f1d_caseD_3:
  uVar12 = 0;
  uVar10 = 0;
  goto LAB_002e6bb2;
}

Assistant:

bool TrackEvent::ParseFromArray(const void* raw, size_t size) {
  category_iids_.clear();
  categories_.clear();
  extra_counter_track_uuids_.clear();
  extra_counter_values_.clear();
  extra_double_counter_track_uuids_.clear();
  extra_double_counter_values_.clear();
  flow_ids_.clear();
  terminating_flow_ids_.clear();
  debug_annotations_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 3 /* category_iids */:
        category_iids_.emplace_back();
        field.get(&category_iids_.back());
        break;
      case 22 /* categories */:
        categories_.emplace_back();
        field.get(&categories_.back());
        break;
      case 10 /* name_iid */:
        field.get(&name_iid_);
        break;
      case 23 /* name */:
        field.get(&name_);
        break;
      case 9 /* type */:
        field.get(&type_);
        break;
      case 11 /* track_uuid */:
        field.get(&track_uuid_);
        break;
      case 30 /* counter_value */:
        field.get(&counter_value_);
        break;
      case 44 /* double_counter_value */:
        field.get(&double_counter_value_);
        break;
      case 31 /* extra_counter_track_uuids */:
        extra_counter_track_uuids_.emplace_back();
        field.get(&extra_counter_track_uuids_.back());
        break;
      case 12 /* extra_counter_values */:
        extra_counter_values_.emplace_back();
        field.get(&extra_counter_values_.back());
        break;
      case 45 /* extra_double_counter_track_uuids */:
        extra_double_counter_track_uuids_.emplace_back();
        field.get(&extra_double_counter_track_uuids_.back());
        break;
      case 46 /* extra_double_counter_values */:
        extra_double_counter_values_.emplace_back();
        field.get(&extra_double_counter_values_.back());
        break;
      case 36 /* flow_ids */:
        flow_ids_.emplace_back();
        field.get(&flow_ids_.back());
        break;
      case 42 /* terminating_flow_ids */:
        terminating_flow_ids_.emplace_back();
        field.get(&terminating_flow_ids_.back());
        break;
      case 4 /* debug_annotations */:
        debug_annotations_.emplace_back();
        debug_annotations_.back().ParseFromArray(field.data(), field.size());
        break;
      case 5 /* task_execution */:
        (*task_execution_).ParseFromArray(field.data(), field.size());
        break;
      case 21 /* log_message */:
        (*log_message_).ParseFromArray(field.data(), field.size());
        break;
      case 24 /* cc_scheduler_state */:
        (*cc_scheduler_state_).ParseFromArray(field.data(), field.size());
        break;
      case 25 /* chrome_user_event */:
        (*chrome_user_event_).ParseFromArray(field.data(), field.size());
        break;
      case 26 /* chrome_keyed_service */:
        (*chrome_keyed_service_).ParseFromArray(field.data(), field.size());
        break;
      case 27 /* chrome_legacy_ipc */:
        (*chrome_legacy_ipc_).ParseFromArray(field.data(), field.size());
        break;
      case 28 /* chrome_histogram_sample */:
        (*chrome_histogram_sample_).ParseFromArray(field.data(), field.size());
        break;
      case 29 /* chrome_latency_info */:
        (*chrome_latency_info_).ParseFromArray(field.data(), field.size());
        break;
      case 32 /* chrome_frame_reporter */:
        (*chrome_frame_reporter_).ParseFromArray(field.data(), field.size());
        break;
      case 39 /* chrome_application_state_info */:
        (*chrome_application_state_info_).ParseFromArray(field.data(), field.size());
        break;
      case 40 /* chrome_renderer_scheduler_state */:
        (*chrome_renderer_scheduler_state_).ParseFromArray(field.data(), field.size());
        break;
      case 41 /* chrome_window_handle_event_info */:
        (*chrome_window_handle_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 43 /* chrome_content_settings_event_info */:
        (*chrome_content_settings_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 33 /* source_location */:
        (*source_location_).ParseFromArray(field.data(), field.size());
        break;
      case 34 /* source_location_iid */:
        field.get(&source_location_iid_);
        break;
      case 35 /* chrome_message_pump */:
        (*chrome_message_pump_).ParseFromArray(field.data(), field.size());
        break;
      case 38 /* chrome_mojo_event_info */:
        (*chrome_mojo_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 1 /* timestamp_delta_us */:
        field.get(&timestamp_delta_us_);
        break;
      case 16 /* timestamp_absolute_us */:
        field.get(&timestamp_absolute_us_);
        break;
      case 2 /* thread_time_delta_us */:
        field.get(&thread_time_delta_us_);
        break;
      case 17 /* thread_time_absolute_us */:
        field.get(&thread_time_absolute_us_);
        break;
      case 8 /* thread_instruction_count_delta */:
        field.get(&thread_instruction_count_delta_);
        break;
      case 20 /* thread_instruction_count_absolute */:
        field.get(&thread_instruction_count_absolute_);
        break;
      case 6 /* legacy_event */:
        (*legacy_event_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}